

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::showEvent(QComboBox *this,QShowEvent *e)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((*(byte *)(lVar1 + 0x34c) & 1) == 0) && (*(int *)(lVar1 + 0x324) == 1)) {
    *(undefined8 *)(lVar1 + 0x318) = 0xffffffffffffffff;
    QWidget::updateGeometry(&this->super_QWidget);
  }
  *(byte *)(lVar1 + 0x34c) = *(byte *)(lVar1 + 0x34c) | 1;
  QWidget::showEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QComboBox::showEvent(QShowEvent *e)
{
    Q_D(QComboBox);
    if (!d->shownOnce && d->sizeAdjustPolicy == QComboBox::AdjustToContentsOnFirstShow) {
        d->sizeHint = QSize();
        updateGeometry();
    }
    d->shownOnce = true;
    QWidget::showEvent(e);
}